

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

Var Js::JavascriptOperators::NewScObjectNoArgNoCtorCommon
              (Var instance,ScriptContext *requestContext,bool isBaseClassConstructorNewScObject)

{
  code *pcVar1;
  bool bVar2;
  RecyclableObject *function;
  FunctionInfo *functionInfo;
  undefined4 *puVar3;
  Var pvVar4;
  
  function = VarTo<Js::RecyclableObject>(instance);
  functionInfo = GetConstructorFunctionInfo(instance,requestContext);
  if (functionInfo == (FunctionInfo *)JavascriptObject::EntryInfo::NewInstance) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x18a5,
                                "(functionInfo != &JavascriptObject::EntryInfo::NewInstance)",
                                "functionInfo != &JavascriptObject::EntryInfo::NewInstance");
    if (!bVar2) goto LAB_00ac3721;
    *puVar3 = 0;
  }
  if (functionInfo == (FunctionInfo *)JavascriptArray::EntryInfo::NewInstance) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x18a6,"(functionInfo != &JavascriptArray::EntryInfo::NewInstance)"
                                ,"functionInfo != &JavascriptArray::EntryInfo::NewInstance");
    if (!bVar2) {
LAB_00ac3721:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if (functionInfo != (FunctionInfo *)0x0) {
    pvVar4 = NewScObjectCommon(function,functionInfo,requestContext,
                               isBaseClassConstructorNewScObject);
    return pvVar4;
  }
  pvVar4 = NewScObjectHostDispatchOrProxy(function,requestContext);
  return pvVar4;
}

Assistant:

Var JavascriptOperators::NewScObjectNoArgNoCtorCommon(Var instance, ScriptContext* requestContext, bool isBaseClassConstructorNewScObject)
    {
        RecyclableObject * object = VarTo<RecyclableObject>(instance);
        FunctionInfo* functionInfo = JavascriptOperators::GetConstructorFunctionInfo(instance, requestContext);
        Assert(functionInfo != &JavascriptObject::EntryInfo::NewInstance); // built-ins are not inlined
        Assert(functionInfo != &JavascriptArray::EntryInfo::NewInstance); // built-ins are not inlined

        return functionInfo != nullptr ?
            JavascriptOperators::NewScObjectCommon(object, functionInfo, requestContext, isBaseClassConstructorNewScObject) :
            JavascriptOperators::NewScObjectHostDispatchOrProxy(object, requestContext);
    }